

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

int Of_CutDeref_rec(Of_Man_t *p,int *pCut)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  uVar3 = *pCut & 0x1f;
  iVar5 = 1;
  if (((p->Iter & 1) == 0) && (iVar5 = 0, 1 < uVar3)) {
    iVar5 = uVar3 + p->pPars->nAreaTuner;
  }
  else if (uVar3 == 0) {
    return iVar5;
  }
  uVar6 = 0;
  do {
    uVar3 = pCut[uVar6 + 1];
    if ((int)uVar3 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    if (uVar3 < 2) {
      return iVar5;
    }
    uVar3 = uVar3 >> 1;
    uVar2 = p->pObjs[uVar3].iCutH;
    if (uVar2 != 0) {
      piVar1 = &p->pObjs[uVar3].nRefs;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        if (p->pGia->nObjs <= (int)uVar3) {
          __assert_fail("iObj>0 && iObj<Gia_ManObjNum(p->pGia)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                        ,0x90,"int *Of_ObjCutBestP(Of_Man_t *, int)");
        }
        uVar3 = (int)uVar2 >> 0x10;
        if (((int)uVar3 < 0) || ((p->vPages).nSize <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar4 = Of_CutDeref_rec(p,(int *)((ulong)((uVar2 & 0xffff) << 2) +
                                         (long)(p->vPages).pArray[uVar3]));
        iVar5 = iVar5 + iVar4;
      }
    }
    uVar6 = uVar6 + 1;
    if ((*pCut & 0x1f) <= uVar6) {
      return iVar5;
    }
  } while( true );
}

Assistant:

int Of_CutDeref_rec( Of_Man_t * p, int * pCut )
{
    int i, Var, Count = (p->Iter & 1) ? 1 : Of_CutArea(p, Of_CutSize(pCut));
    Of_CutForEachVar( pCut, Var, i )
        if ( Of_ObjCutBest(p, Var) && !Of_ObjRefDec(p, Var) )
            Count += Of_CutDeref_rec( p, Of_ObjCutBestP(p, Var) );
    return Count;
}